

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O3

PSNode * __thiscall
dg::pta::PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long>
          (PointerGraph *this,PSNode **args,unsigned_long *args_1)

{
  iterator __position;
  PSNode *n;
  _Head_base<0UL,_dg::pta::PSNode_*,_false> local_18;
  
  local_18._M_head_impl =
       &nodeFactory<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long,dg::pta::PSNodeGep>
                  (this,args,args_1)->super_PSNode;
  __position._M_current =
       *(unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> **)(this + 0x18);
  if (__position._M_current ==
      *(unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> **)(this + 0x20)) {
    std::
    vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
    ::_M_realloc_insert<dg::pta::PSNode*&>
              ((vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
                *)(this + 0x10),__position,&local_18._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
    super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
    super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl = local_18._M_head_impl;
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 8;
  }
  return local_18._M_head_impl;
}

Assistant:

PSNode *create(Args &&...args) {
        PSNode *n = nodeFactory<Type>(std::forward<Args>(args)...);
        nodes.emplace_back(n); // C++17 returns a referece
        assert(n->getID() == nodes.size() - 1);
        return n;
    }